

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.cpp
# Opt level: O2

shared_ptr<SchemeObject>
make_function(string *name,
             list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *l,
             Context *context,string *form)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  bool bVar4;
  _List_const_iterator<std::shared_ptr<ASTNode>_> _Var5;
  eval_error *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  _List_node_base *p_Var7;
  bool bVar8;
  shared_ptr<SchemeObject> sVar9;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  shared_ptr<SchemeCompoundProcedure> f;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> pl;
  
  if (((context->locals).
       super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
       ._M_impl._M_node._M_size < 2) ||
     (l = (list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
          (context->locals).
          super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next[1]._M_next,
     *(int *)&(l->
              super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
              )._M_impl._M_node.super__List_node_base._M_next != 0)) {
    peVar6 = (eval_error *)__cxa_allocate_exception(0x10,l);
    std::operator+(&local_88,in_R8,": parameters and code required");
    eval_error::runtime_error(peVar6,&local_88);
    __cxa_throw(peVar6,&eval_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::list
            (&pl,(list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                 &l[1].
                  super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                  ._M_impl._M_node._M_size);
  bVar3 = std::operator==(in_R8,"define");
  if (!bVar3) {
    bVar3 = std::operator==(in_R8,"named-lambda");
    if (!bVar3) goto LAB_00125a2e;
  }
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
  pop_front(&pl);
LAB_00125a2e:
  std::make_shared<SchemeCompoundProcedure,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
  bVar8 = false;
  p_Var7 = (_List_node_base *)&pl;
  bVar4 = false;
  lStack_a0 = 0;
  bVar3 = true;
  while( true ) {
    while( true ) {
      p_Var7 = (((_List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *
                 )&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var7 == (_List_node_base *)&pl) {
        if (!bVar4) {
          for (_Var5 = std::next<std::_List_const_iterator<std::shared_ptr<ASTNode>>>
                                 ((context->locals).
                                  super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
                                  ._M_impl._M_node.super__List_node_base._M_next,1);
              (Context *)_Var5._M_node != context;
              _Var5._M_node =
                   (((Context *)_Var5._M_node)->locals).
                   super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next) {
            std::__cxx11::list<ASTNode,_std::allocator<ASTNode>_>::push_back
                      (&(f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->body,
                       (value_type *)
                       (((Context *)_Var5._M_node)->locals).
                       super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
                       ._M_impl._M_node._M_size);
          }
          Context::operator=(&(f.
                               super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->context,(Context *)form);
          _Var2 = f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
          f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (name->_M_dataplus)._M_p =
               (pointer)f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          name->_M_string_length = (size_type)_Var2._M_pi;
          f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::
          _List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::_M_clear
                    (&pl.
                      super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                    );
          sVar9.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               extraout_RDX._M_pi;
          sVar9.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)name;
          return (shared_ptr<SchemeObject>)
                 sVar9.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
        }
        peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_88,in_R8,": invalid declaration");
        eval_error::runtime_error(peVar6,&local_88);
        __cxa_throw(peVar6,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*(int *)p_Var7[1]._M_next != 1) {
        peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_88,in_R8,": list of names required");
        eval_error::runtime_error(peVar6,&local_88);
        __cxa_throw(peVar6,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)p_Var7[1]._M_next + 8),"#!optional");
      if (!bVar4) break;
      bVar8 = false;
      bVar4 = false;
      lStack_a0 = 1;
      bVar1 = !bVar3;
      bVar3 = false;
      if (bVar1) {
        peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_88,in_R8,": invalid declaration");
        eval_error::runtime_error(peVar6,&local_88);
        __cxa_throw(peVar6,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)p_Var7[1]._M_next + 8),"#!rest");
    if (!bVar3) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)p_Var7[1]._M_next + 8),".");
      if (!bVar3) {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->params,(value_type *)((long)p_Var7[1]._M_next + 8));
        sVar9.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)
             (*(code *)((long)&DAT_00145180 + (long)(int)(&DAT_00145180)[lStack_a0]))();
        return (shared_ptr<SchemeObject>)
               sVar9.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
      }
    }
    if (bVar8) break;
    ((f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_SchemeProcedure).arity.second = -1;
    bVar8 = true;
    bVar3 = false;
    bVar4 = true;
    lStack_a0 = 2;
  }
  peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_88,in_R8,": invalid declaration");
  eval_error::runtime_error(peVar6,&local_88);
  __cxa_throw(peVar6,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::shared_ptr<SchemeObject>
make_function(const std::string &name, const std::list<std::shared_ptr<ASTNode>> &l, const Context &context,
              const std::string &form)
{
    if(l.size() < 2 || l.front()->type != ast_type_t::LIST)
        throw eval_error(form + ": parameters and code required");
    auto pl = l.front()->list;
    if(form == "define" || form == "named-lambda")
        pl.pop_front();
    auto f = std::make_shared<SchemeCompoundProcedure>(name);
    int state = 0;
    for(const auto &i : pl)
    {
        if(i->type != ast_type_t::NAME)
            throw eval_error(form + ": list of names required");
        if(i->value == "#!optional")
        {
            if(state != 0)
                throw eval_error(form + ": invalid declaration");
            state = 1;
        }
        else if(i->value == "#!rest" || i->value == ".")
        {
            if(state > 1)
                throw eval_error(form + ": invalid declaration");
            state = 2;
            f->arity.second = -1;
        }
        else
        {
            f->params.push_back(i->value);
            if(state == 0)
            {
                ++f->arity.first;
                ++f->arity.second;
            }
            else if(state == 1)
            {
                ++f->arity.second;
            }
            else if(state == 2)
            {
                state = 3;
            }
            else
                throw eval_error(form + ": invalid declaration");
        }
    }
    if(state == 2)
        throw eval_error(form + ": invalid declaration");
    for(auto i = next(l.begin()); i != l.end(); ++i)
    {
        f->body.push_back(**i);
    }
    f->context = context;
    return f;
}